

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void generate_gauss(kernel_t *ker,float sig)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  float fVar4;
  undefined4 in_XMM0_Db;
  double dVar5;
  double dVar6;
  
  fVar4 = (float)(double)CONCAT44(in_XMM0_Db,sig);
  dVar6 = (double)fVar4;
  uVar1 = (int)(dVar6 * 6.0 + 1.0) | 1;
  ker->f = 0.0;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    uVar3 = (uint)((double)(int)uVar1 * 0.5);
    if (-1 < (int)uVar3) {
      lVar2 = 0;
      do {
        dVar5 = (double)(int)((int)lVar2 - uVar3);
        dVar5 = exp((-dVar5 * dVar5) / (dVar6 * dVar6 + dVar6 * dVar6));
        fVar4 = (float)(dVar5 / (dVar6 * 2.5066282746310002));
        *(float *)((long)ker + lVar2 * 4 + (ulong)uVar3 * 4 + (long)(int)uVar3 * -4) = fVar4;
        ker->f = fVar4 + ker->f;
        lVar2 = lVar2 + 1;
      } while (uVar3 * 2 + 1 != (int)lVar2);
    }
  }
  else {
    ker->k[0] = 1.0;
    ker->f = 1.0;
  }
  ker->m = uVar1;
  return;
}

Assistant:

void generate_gauss(ker,sig)
kernel_t *ker ;
float sig ;

{ int i, h ;

  h = (int)(sig*6.0 + 1.0) ;
  if (h%2 == 0) {
    h++ ;
  }
  (*ker).f = 0.0 ;
  if (sig != 0.0) {
    for (i = -(int)(h/2.0) ; i <= (int)(h/2.0) ; i++) {
      (*ker).k[i+(int)(h/2.0)] = exp(-pow((float)i,2.0)/(2.0*pow(sig,2.0)))/
      (sqrt(2.0*M_PI)*sig) ;
      (*ker).f += (*ker).k[i+(int)(h/2.0)] ;
    }
  }
  else {
    (*ker).k[0] = 1.0 ;
    (*ker).f = 1.0 ;
  }
  (*ker).m = h ;
}